

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O1

int __thiscall StringType::StaticSize(StringType *this,Env *env)

{
  if (*(int *)&(this->super_Type).field_0x18c != 0) {
    return -1;
  }
  return (int)(this->str_->unescaped_)._M_string_length;
}

Assistant:

int StringType::StaticSize(Env* env) const
	{
	switch ( type_ )
		{
		case CSTR:
			// Use length of the unescaped string
			return str_->unescaped().length();
		case REGEX:
			// TODO: static size for a regular expression?
		case ANYSTR:
			return -1;

		default:
			ASSERT(0);
			return -1;
		}
	}